

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

int new_localvar(LexState *ls,TString *name)

{
  FuncState *fs;
  Dyndata *pDVar1;
  Vardesc *pVVar2;
  int iVar3;
  
  fs = ls->fs;
  pDVar1 = ls->dyd;
  iVar3 = (pDVar1->actvar).n + 1;
  if (iVar3 - fs->firstlocal < 0xc9) {
    pVVar2 = (Vardesc *)
             luaM_growaux_(ls->L,(pDVar1->actvar).arr,iVar3,&(pDVar1->actvar).size,0x18,0xffff,
                           "local variables");
    (pDVar1->actvar).arr = pVVar2;
    iVar3 = (pDVar1->actvar).n;
    (pDVar1->actvar).n = iVar3 + 1;
    *(undefined1 *)((long)pVVar2 + (long)iVar3 * 0x18 + 9) = 0;
    *(TString **)((long)pVVar2 + (long)iVar3 * 0x18 + 0x10) = name;
    return ~fs->firstlocal + (pDVar1->actvar).n;
  }
  errorlimit(fs,200,"local variables");
}

Assistant:

static int new_localvar (LexState *ls, TString *name) {
  lua_State *L = ls->L;
  FuncState *fs = ls->fs;
  Dyndata *dyd = ls->dyd;
  Vardesc *var;
  checklimit(fs, dyd->actvar.n + 1 - fs->firstlocal,
                 MAXVARS, "local variables");
  luaM_growvector(L, dyd->actvar.arr, dyd->actvar.n + 1,
                  dyd->actvar.size, Vardesc, USHRT_MAX, "local variables");
  var = &dyd->actvar.arr[dyd->actvar.n++];
  var->vd.kind = VDKREG;  /* default */
  var->vd.name = name;
  return dyd->actvar.n - 1 - fs->firstlocal;
}